

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int ARKodeGetStepStats(void *arkode_mem,long *nsteps,sunrealtype *hinused,sunrealtype *hlast,
                      sunrealtype *hcur,sunrealtype *tcur)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x942,"ARKodeGetStepStats",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    *nsteps = *(long *)((long)arkode_mem + 0x310);
    *hinused = *(sunrealtype *)((long)arkode_mem + 0x358);
    *hlast = *(sunrealtype *)((long)arkode_mem + 0x370);
    *hcur = *(sunrealtype *)((long)arkode_mem + 0x2c0);
    *tcur = *(sunrealtype *)((long)arkode_mem + 0x2d0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ARKodeGetStepStats(void* arkode_mem, long int* nsteps, sunrealtype* hinused,
                       sunrealtype* hlast, sunrealtype* hcur, sunrealtype* tcur)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  *nsteps  = ark_mem->nst;
  *hinused = ark_mem->h0u;
  *hlast   = ark_mem->hold;
  *hcur    = ark_mem->next_h;
  *tcur    = ark_mem->tcur;
  return (ARK_SUCCESS);
}